

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::one_thread::impl::
actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::actual_dispatcher_t
          (actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,disp_params_t *params)

{
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  fStack_38;
  
  actual_disp_iface_t::actual_disp_iface_t(&this->super_actual_disp_iface_t);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__actual_dispatcher_t_002c9da0;
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::function(&fStack_38,&(params->m_queue_params).m_lock_factory);
  reuse::work_thread::details::
  work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::
  work_thread_template_t
            ((work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
              *)&this->m_work_thread,&fStack_38);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  (this->m_work_thread).super_activity_tracking_impl_t.
  super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
  .m_queue.super_with_activity_tracking_impl_t.m_waiting_stats.m_work_started_at.__d.__r = 0;
  data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  ::data_source_t((data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
                   *)&(this->m_work_thread).super_activity_tracking_impl_t.
                      super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                      .m_queue.super_with_activity_tracking_impl_t.m_waiting_stats.m_work_activity,
                  &this->m_work_thread,
                  (atomic<unsigned_long> *)
                  &(this->m_work_thread).super_activity_tracking_impl_t.
                   super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                   .m_queue.super_with_activity_tracking_impl_t.m_waiting_stats.m_work_started_at);
  return;
}

Assistant:

actual_dispatcher_t( disp_params_t params )
			:	m_work_thread{ params.queue_params().lock_factory() }
			,	m_data_source( m_work_thread, m_agents_bound )
			{}